

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cpp
# Opt level: O0

bool __thiscall apngasm_cli::Options::outputJSONFile(Options *this,string *out)

{
  size_type sVar1;
  variable_value *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  key_type local_40;
  string *local_20;
  string *out_local;
  Options *this_local;
  
  local_20 = out;
  out_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"json",&local_41);
  sVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   *)&this->field_0x28,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  if (sVar1 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"json",&local_79);
    this_00 = boost::program_options::variables_map::operator[](&this->vm,&local_78);
    __str = boost::program_options::variable_value::as<std::__cxx11::string>(this_00);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (local_20,__str);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
  }
  return sVar1 != 0;
}

Assistant:

bool Options::outputJSONFile(std::string &out) const {
  if (!vm.count("json")) {
    return false;
  }
  out = vm["json"].as<std::string>();
  return true;
}